

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateCancelRequest(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiPopupData *pIVar4;
  ImRect IVar5;
  ImRect child_rect;
  ImGuiWindow *parent_window;
  ImGuiWindow *child_window;
  ImGuiContext *g;
  ImRect *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  ImGuiNavLayer in_stack_ffffffffffffffc4;
  ImGuiID id;
  ImRect in_stack_ffffffffffffffc8;
  
  pIVar2 = GImGui;
  bVar3 = IsNavInputTest(0,0x13bb7c);
  if (bVar3) {
    if (pIVar2->ActiveId == 0) {
      if (pIVar2->NavLayer == ImGuiNavLayer_Main) {
        if ((((pIVar2->NavWindow == (ImGuiWindow *)0x0) ||
             (pIVar2->NavWindow == pIVar2->NavWindow->RootWindow)) ||
            ((pIVar2->NavWindow->Flags & 0x4000000U) != 0)) ||
           (pIVar2->NavWindow->ParentWindow == (ImGuiWindow *)0x0)) {
          if ((pIVar2->OpenPopupStack).Size < 1) {
            if ((pIVar2->NavWindow != (ImGuiWindow *)0x0) &&
               (((pIVar2->NavWindow->Flags & 0x4000000U) != 0 ||
                ((pIVar2->NavWindow->Flags & 0x1000000U) == 0)))) {
              pIVar2->NavWindow->NavLastIds[0] = 0;
            }
            pIVar2->NavFocusScopeId = 0;
            pIVar2->NavId = 0;
          }
          else {
            pIVar4 = ImVector<ImGuiPopupData>::back(&pIVar2->OpenPopupStack);
            if ((pIVar4->Window->Flags & 0x8000000U) == 0) {
              ClosePopupToLevel((int)in_stack_ffffffffffffffc8.Max.y,
                                in_stack_ffffffffffffffc8.Max.x._3_1_);
            }
          }
        }
        else {
          pIVar1 = pIVar2->NavWindow;
          IVar5 = ImGuiWindow::Rect((ImGuiWindow *)0x13bc6c);
          FocusWindow((ImGuiWindow *)IVar5.Max);
          id = pIVar1->ChildId;
          WindowRectAbsToRel((ImGuiWindow *)CONCAT44(id,in_stack_ffffffffffffffc0),
                             in_stack_ffffffffffffffb8);
          SetNavID(id,ImGuiNavLayer_Main,0,(ImRect *)&stack0xffffffffffffffc8);
          NavRestoreHighlightAfterMove();
        }
      }
      else {
        NavRestoreLayer(in_stack_ffffffffffffffc4);
        NavRestoreHighlightAfterMove();
      }
    }
    else {
      bVar3 = IsActiveIdUsingNavInput(1);
      if (!bVar3) {
        ClearActiveID();
      }
    }
  }
  return;
}

Assistant:

static void ImGui::NavUpdateCancelRequest()
{
    ImGuiContext& g = *GImGui;
    if (!IsNavInputTest(ImGuiNavInput_Cancel, ImGuiInputReadMode_Pressed))
        return;

    IMGUI_DEBUG_LOG_NAV("[nav] ImGuiNavInput_Cancel\n");
    if (g.ActiveId != 0)
    {
        if (!IsActiveIdUsingNavInput(ImGuiNavInput_Cancel))
            ClearActiveID();
    }
    else if (g.NavLayer != ImGuiNavLayer_Main)
    {
        // Leave the "menu" layer
        NavRestoreLayer(ImGuiNavLayer_Main);
        NavRestoreHighlightAfterMove();
    }
    else if (g.NavWindow && g.NavWindow != g.NavWindow->RootWindow && !(g.NavWindow->Flags & ImGuiWindowFlags_Popup) && g.NavWindow->ParentWindow)
    {
        // Exit child window
        ImGuiWindow* child_window = g.NavWindow;
        ImGuiWindow* parent_window = g.NavWindow->ParentWindow;
        IM_ASSERT(child_window->ChildId != 0);
        ImRect child_rect = child_window->Rect();
        FocusWindow(parent_window);
        SetNavID(child_window->ChildId, ImGuiNavLayer_Main, 0, WindowRectAbsToRel(parent_window, child_rect));
        NavRestoreHighlightAfterMove();
    }
    else if (g.OpenPopupStack.Size > 0)
    {
        // Close open popup/menu
        if (!(g.OpenPopupStack.back().Window->Flags & ImGuiWindowFlags_Modal))
            ClosePopupToLevel(g.OpenPopupStack.Size - 1, true);
    }
    else
    {
        // Clear NavLastId for popups but keep it for regular child window so we can leave one and come back where we were
        if (g.NavWindow && ((g.NavWindow->Flags & ImGuiWindowFlags_Popup) || !(g.NavWindow->Flags & ImGuiWindowFlags_ChildWindow)))
            g.NavWindow->NavLastIds[0] = 0;
        g.NavId = g.NavFocusScopeId = 0;
    }
}